

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O0

bool __thiscall
testing::internal::QuantifierMatcherImpl<const_nsh_cmd_(&)[32]>::MatchAndExplainImpl
          (QuantifierMatcherImpl<const_nsh_cmd_(&)[32]> *this,bool all_elements_should_match,
          nsh_cmd (*container) [32],MatchResultListener *listener)

{
  bool bVar1;
  byte bVar2;
  const_iterator pnVar3;
  MatchResultListener *pMVar4;
  ostream *os;
  string local_238;
  char *local_218;
  byte local_209;
  undefined1 local_208 [7];
  bool matches;
  StringMatchResultListener inner_listener;
  nsh_cmd *local_60;
  const_iterator it;
  size_t i;
  StlContainerReference stl_container;
  MatchResultListener *listener_local;
  nsh_cmd (*container_local) [32];
  bool all_elements_should_match_local;
  QuantifierMatcherImpl<const_nsh_cmd_(&)[32]> *this_local;
  
  stl_container._24_8_ = listener;
  StlContainerView<nsh_cmd[32]>::ConstReference((const_reference *)&i,container);
  it = (const_iterator)0x0;
  for (local_60 = NativeArray<nsh_cmd>::begin((const_reference *)&i);
      pnVar3 = NativeArray<nsh_cmd>::end((NativeArray<nsh_cmd> *)&i),
      bVar2 = all_elements_should_match, local_60 != pnVar3; local_60 = local_60 + 1) {
    StringMatchResultListener::StringMatchResultListener((StringMatchResultListener *)local_208);
    local_209 = MatcherBase<const_nsh_cmd_&>::MatchAndExplain
                          (&(this->inner_matcher_).super_MatcherBase<const_nsh_cmd_&>,local_60,
                           (MatchResultListener *)local_208);
    if ((bool)local_209 == all_elements_should_match) {
      bVar1 = false;
    }
    else {
      pMVar4 = MatchResultListener::operator<<
                         ((MatchResultListener *)stl_container._24_8_,
                          (char (*) [16])"whose element #");
      pMVar4 = MatchResultListener::operator<<(pMVar4,(unsigned_long *)&it);
      local_218 = " doesn\'t match";
      if ((local_209 & 1) != 0) {
        local_218 = " matches";
      }
      MatchResultListener::operator<<(pMVar4,&local_218);
      StringMatchResultListener::str_abi_cxx11_(&local_238,(StringMatchResultListener *)local_208);
      os = MatchResultListener::stream((MatchResultListener *)stl_container._24_8_);
      PrintIfNotEmpty(&local_238,os);
      std::__cxx11::string::~string((string *)&local_238);
      this_local._7_1_ = (all_elements_should_match ^ 0xffU) & 1;
      bVar1 = true;
    }
    StringMatchResultListener::~StringMatchResultListener((StringMatchResultListener *)local_208);
    bVar2 = this_local._7_1_;
    if (bVar1) break;
    it = (const_iterator)((long)&it->handler + 1);
  }
  this_local._7_1_ = bVar2;
  NativeArray<nsh_cmd>::~NativeArray((NativeArray<nsh_cmd> *)&i);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MatchAndExplainImpl(bool all_elements_should_match, Container container,
                           MatchResultListener* listener) const {
    StlContainerReference stl_container = View::ConstReference(container);
    size_t i = 0;
    for (auto it = stl_container.begin(); it != stl_container.end();
         ++it, ++i) {
      StringMatchResultListener inner_listener;
      const bool matches = inner_matcher_.MatchAndExplain(*it, &inner_listener);

      if (matches != all_elements_should_match) {
        *listener << "whose element #" << i
                  << (matches ? " matches" : " doesn't match");
        PrintIfNotEmpty(inner_listener.str(), listener->stream());
        return !all_elements_should_match;
      }
    }
    return all_elements_should_match;
  }